

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

bool __thiscall spvtools::opt::analysis::Array::IsSameImpl(Array *this,Type *that,IsSameCache *seen)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  bool local_42;
  bool local_41;
  bool is_same;
  Array *at;
  IsSameCache *seen_local;
  Type *that_local;
  Array *this_local;
  long lVar3;
  
  iVar1 = (*that->_vptr_Type[0x18])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (lVar3 == 0) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = (*this->element_type_->_vptr_Type[2])
                      (this->element_type_,*(undefined8 *)(lVar3 + 0x28),seen);
    local_41 = false;
    if ((uVar2 & 1) != 0) {
      local_41 = analysis::Type::HasSameDecorations(&this->super_Type,that);
    }
    local_42 = false;
    if (local_41 != false) {
      local_42 = std::operator==(&(this->length_info_).words,
                                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 (lVar3 + 0x38));
    }
    this_local._7_1_ = local_42;
  }
  return this_local._7_1_;
}

Assistant:

bool Array::IsSameImpl(const Type* that, IsSameCache* seen) const {
  const Array* at = that->AsArray();
  if (!at) return false;
  bool is_same = element_type_->IsSameImpl(at->element_type_, seen);
  is_same = is_same && HasSameDecorations(that);
  is_same = is_same && (length_info_.words == at->length_info_.words);
  return is_same;
}